

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

float __thiscall
duckdb::Interpolator<true>::Interpolate<unsigned_long,float,duckdb::QuantileIndirect<float>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<float> *accessor)

{
  RESULT_TYPE_conflict3 input;
  float fVar1;
  unsigned_long local_8;
  
  local_8 = lidx;
  input = QuantileIndirect<float>::operator()(accessor,&local_8);
  fVar1 = Cast::Operation<float,float>(input);
  return fVar1;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}